

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall
OSSLEVPSymmetricAlgorithm::encryptInit
          (OSSLEVPSymmetricAlgorithm *this,SymmetricKey *key,Type mode,ByteString *IV,bool padding,
          size_t counterBits,ByteString *aad,size_t tagBytes)

{
  EVP_CIPHER *cipher_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EVP_CIPHER_CTX *pEVar4;
  uchar *puVar5;
  uchar *puVar6;
  ulong uVar7;
  char *pcVar8;
  ByteString *in_RCX;
  Type in_EDX;
  SymmetricKey *in_RSI;
  SymmetricAlgorithm *in_RDI;
  byte in_R8B;
  size_t in_R9;
  ByteString *in_stack_00000008;
  OSSLEVPSymmetricAlgorithm *in_stack_00000010;
  ByteString dummy_4;
  int outLen;
  ByteString dummy_3;
  int rv;
  ByteString dummy_2;
  ByteString dummy_1;
  EVP_CIPHER *cipher;
  ByteString iv;
  ByteString dummy;
  OSSLEVPSymmetricAlgorithm *this_00;
  size_t in_stack_fffffffffffffda8;
  ByteString *in_stack_fffffffffffffdb0;
  ByteString *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  ByteString local_158;
  int local_12c;
  ByteString local_128;
  int local_fc;
  ByteString local_f8;
  undefined4 local_cc;
  ByteString local_c8;
  EVP_CIPHER *local_a0;
  ByteString local_60;
  byte local_29;
  Type local_1c;
  byte local_1;
  
  local_29 = in_R8B & 1;
  local_1c = in_EDX;
  bVar1 = SymmetricAlgorithm::encryptInit
                    (in_RDI,in_RSI,in_EDX,in_RCX,(bool)local_29,in_R9,in_stack_00000008,
                     (size_t)in_stack_00000010);
  if (!bVar1) {
    local_1 = 0;
    goto LAB_001331bb;
  }
  this_00 = in_stack_00000010;
  if ((local_1c != GCM) &&
     (sVar3 = ByteString::size((ByteString *)0x1329f3), this_00 = in_stack_00000010, sVar3 != 0)) {
    sVar3 = ByteString::size((ByteString *)0x132a0a);
    iVar2 = (*in_RDI->_vptr_SymmetricAlgorithm[0xd])();
    this_00 = in_stack_00000010;
    if (sVar3 != CONCAT44(extraout_var,iVar2)) {
      sVar3 = ByteString::size((ByteString *)0x132a41);
      iVar2 = (*in_RDI->_vptr_SymmetricAlgorithm[0xd])();
      softHSMLog(3,"encryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x79,"Invalid IV size (%d bytes, expected %d bytes)",sVar3,
                 CONCAT44(extraout_var_00,iVar2));
      ByteString::ByteString((ByteString *)0x132aa6);
      SymmetricAlgorithm::encryptFinal(in_RDI,&local_60);
      local_1 = 0;
      ByteString::~ByteString((ByteString *)0x132ad2);
      goto LAB_001331bb;
    }
  }
  ByteString::ByteString((ByteString *)0x132b0a);
  sVar3 = ByteString::size((ByteString *)0x132b17);
  if (sVar3 == 0) {
    (*in_RDI->_vptr_SymmetricAlgorithm[0xd])();
    ByteString::wipe(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  }
  else {
    ByteString::operator=((ByteString *)this_00,in_stack_00000008);
  }
  counterBitsInit((OSSLEVPSymmetricAlgorithm *)
                  CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                  in_stack_fffffffffffffdb8,(size_t)in_stack_fffffffffffffdb0);
  iVar2 = (*in_RDI->_vptr_SymmetricAlgorithm[0x15])();
  local_a0 = (EVP_CIPHER *)CONCAT44(extraout_var_01,iVar2);
  if (local_a0 == (EVP_CIPHER *)0x0) {
    softHSMLog(3,"encryptInit",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
               ,0x93,"Failed to initialise EVP encrypt operation");
    ByteString::ByteString((ByteString *)0x132c26);
    SymmetricAlgorithm::encryptFinal(in_RDI,&local_c8);
    local_1 = 0;
    local_cc = 1;
    ByteString::~ByteString((ByteString *)0x132c5f);
  }
  else {
    pEVar4 = EVP_CIPHER_CTX_new();
    cipher_00 = local_a0;
    in_RDI[1]._vptr_SymmetricAlgorithm = (_func_int **)pEVar4;
    if (in_RDI[1]._vptr_SymmetricAlgorithm == (_func_int **)0x0) {
      softHSMLog(3,"encryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0xa0,"Failed to allocate space for EVP_CIPHER_CTX");
      ByteString::ByteString((ByteString *)0x132ced);
      SymmetricAlgorithm::encryptFinal(in_RDI,&local_f8);
      local_1 = 0;
      local_cc = 1;
      ByteString::~ByteString((ByteString *)0x132d26);
    }
    else {
      if (local_1c == GCM) {
        local_fc = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)in_RDI[1]._vptr_SymmetricAlgorithm,local_a0,
                                      (ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0);
        if (local_fc != 0) {
          pEVar4 = (EVP_CIPHER_CTX *)in_RDI[1]._vptr_SymmetricAlgorithm;
          sVar3 = ByteString::size((ByteString *)0x132dc9);
          EVP_CIPHER_CTX_ctrl(pEVar4,9,(int)sVar3,(void *)0x0);
          pEVar4 = (EVP_CIPHER_CTX *)in_RDI[1]._vptr_SymmetricAlgorithm;
          (*(in_RDI->currentKey->super_Serialisable)._vptr_Serialisable[4])();
          puVar5 = ByteString::const_byte_str(in_stack_00000008);
          puVar6 = ByteString::byte_str(in_stack_00000008);
          local_fc = EVP_EncryptInit_ex(pEVar4,(EVP_CIPHER *)0x0,(ENGINE *)0x0,puVar5,puVar6);
        }
      }
      else {
        pEVar4 = (EVP_CIPHER_CTX *)in_RDI[1]._vptr_SymmetricAlgorithm;
        (*(in_RDI->currentKey->super_Serialisable)._vptr_Serialisable[4])();
        puVar5 = ByteString::const_byte_str(in_stack_00000008);
        puVar6 = ByteString::byte_str(in_stack_00000008);
        local_fc = EVP_EncryptInit(pEVar4,cipher_00,puVar5,puVar6);
      }
      if (local_fc == 0) {
        uVar7 = ERR_get_error();
        pcVar8 = ERR_error_string(uVar7,(char *)0x0);
        softHSMLog(3,"encryptInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                   ,0xba,"Failed to initialise EVP encrypt operation: %s",pcVar8);
        clean(this_00);
        ByteString::ByteString((ByteString *)0x132f93);
        SymmetricAlgorithm::encryptFinal(in_RDI,&local_128);
        local_1 = 0;
        local_cc = 1;
        ByteString::~ByteString((ByteString *)0x132fcc);
      }
      else {
        EVP_CIPHER_CTX_set_padding
                  ((EVP_CIPHER_CTX *)in_RDI[1]._vptr_SymmetricAlgorithm,local_29 & 1);
        if (local_1c == GCM) {
          local_12c = 0;
          sVar3 = ByteString::size((ByteString *)0x13303b);
          if (sVar3 != 0) {
            pEVar4 = (EVP_CIPHER_CTX *)in_RDI[1]._vptr_SymmetricAlgorithm;
            puVar5 = ByteString::const_byte_str(in_stack_00000008);
            sVar3 = ByteString::size((ByteString *)0x133083);
            iVar2 = EVP_EncryptUpdate(pEVar4,(uchar *)0x0,&local_12c,puVar5,(int)sVar3);
            if (iVar2 == 0) {
              uVar7 = ERR_get_error();
              pcVar8 = ERR_error_string(uVar7,(char *)0x0);
              softHSMLog(3,"encryptInit",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                         ,0xcb,"Failed to update with AAD: %s",pcVar8);
              clean(this_00);
              ByteString::ByteString((ByteString *)0x13312a);
              SymmetricAlgorithm::encryptFinal(in_RDI,&local_158);
              local_1 = 0;
              local_cc = 1;
              ByteString::~ByteString((ByteString *)0x133163);
              goto LAB_0013319d;
            }
          }
        }
        local_1 = 1;
        local_cc = 1;
      }
    }
  }
LAB_0013319d:
  ByteString::~ByteString((ByteString *)0x1331aa);
LAB_001331bb:
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::encryptInit(const SymmetricKey* key, const SymMode::Type mode /* = SymMode::CBC */, const ByteString& IV /* = ByteString()*/, bool padding /* = true */, size_t counterBits /* = 0 */, const ByteString& aad /* = ByteString() */, size_t tagBytes /* = 0 */)
{
	// Call the superclass initialiser
	if (!SymmetricAlgorithm::encryptInit(key, mode, IV, padding, counterBits, aad, tagBytes))
	{
		return false;
	}

	// Check the IV
	if (mode != SymMode::GCM && (IV.size() > 0) && (IV.size() != getBlockSize()))
	{
		ERROR_MSG("Invalid IV size (%d bytes, expected %d bytes)", IV.size(), getBlockSize());

		ByteString dummy;
		SymmetricAlgorithm::encryptFinal(dummy);

		return false;
	}

	ByteString iv;

	if (IV.size() > 0)
	{
		iv = IV;
	}
	else
	{
		iv.wipe(getBlockSize());
	}

	counterBitsInit(iv, counterBits);

	// Determine the cipher class
	const EVP_CIPHER* cipher = getCipher();

	if (cipher == NULL)
	{
		ERROR_MSG("Failed to initialise EVP encrypt operation");

		ByteString dummy;
		SymmetricAlgorithm::encryptFinal(dummy);

		return false;
	}

	// Allocate the EVP context
	pCurCTX = EVP_CIPHER_CTX_new();

	if (pCurCTX == NULL)
	{
		ERROR_MSG("Failed to allocate space for EVP_CIPHER_CTX");

		ByteString dummy;
		SymmetricAlgorithm::encryptFinal(dummy);

		return false;
	}

	int rv;
	if (mode == SymMode::GCM)
	{
		rv = EVP_EncryptInit_ex(pCurCTX, cipher, NULL, NULL, NULL);

		if (rv)
		{
			EVP_CIPHER_CTX_ctrl(pCurCTX, EVP_CTRL_GCM_SET_IVLEN, iv.size(), NULL);
			rv = EVP_EncryptInit_ex(pCurCTX, NULL, NULL, (unsigned char*) currentKey->getKeyBits().const_byte_str(), iv.byte_str());
		}
	}
	else
	{
		rv = EVP_EncryptInit(pCurCTX, cipher, (unsigned char*) currentKey->getKeyBits().const_byte_str(), iv.byte_str());
	}

	if (!rv)
	{
		ERROR_MSG("Failed to initialise EVP encrypt operation: %s", ERR_error_string(ERR_get_error(), NULL));

		clean();

		ByteString dummy;
		SymmetricAlgorithm::encryptFinal(dummy);

		return false;
	}

	EVP_CIPHER_CTX_set_padding(pCurCTX, padding ? 1 : 0);

	if (mode == SymMode::GCM)
	{
		int outLen = 0;
		if (aad.size() && !EVP_EncryptUpdate(pCurCTX, NULL, &outLen, (unsigned char*) aad.const_byte_str(), aad.size()))
		{
			ERROR_MSG("Failed to update with AAD: %s", ERR_error_string(ERR_get_error(), NULL));

			clean();

			ByteString dummy;
			SymmetricAlgorithm::encryptFinal(dummy);

			return false;
		}
	}

	return true;
}